

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  lscpp_message_handler local_44;
  _Head_base<0UL,_lscpp::transporter::iface_*,_false> local_40;
  stdio_transporter local_38;
  
  local_44.shutdown_ = false;
  local_44.initialized_ = false;
  local_44.ready_ = false;
  lscpp::stdio_transporter::stdio_transporter(&local_38,false);
  lscpp::transporter::transporter<lscpp::stdio_transporter>((transporter *)&local_40,&local_38);
  lscpp::experimental::launch<my_lsp_server::server>((server *)&local_44,(transporter *)&local_40);
  if (local_40._M_head_impl != (iface *)0x0) {
    (*(local_40._M_head_impl)->_vptr_iface[1])();
  }
  local_40._M_head_impl = (iface *)0x0;
  lscpp::stdio_transporter::~stdio_transporter(&local_38);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  lscpp::experimental::launch(my_lsp_server::server{},
                              lscpp::stdio_transporter{false});
}